

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O1

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CWhileStm *stm)

{
  char *pcVar1;
  IExpression *pIVar2;
  IStatement *pIVar3;
  bool bVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  TypeInfo *in_RCX;
  string errorMessage;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90 [2];
  string local_70;
  TypeInfo local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"typechecker: CWhileStm\n",0x17);
  pIVar2 = (stm->conditionExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if ((pIVar2 == (IExpression *)0x0) ||
     ((stm->statement)._M_t.super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t
      .super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
      super__Head_base<0UL,_IStatement_*,_false>._M_head_impl == (IStatement *)0x0)) {
    CError::CError((CError *)local_a0,&CError::AST_ERROR_abi_cxx11_,
                   &(stm->super_IStatement).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_a0);
    paVar5 = local_90;
  }
  else {
    (*(code *)*(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
    TypeInfo::TypeInfo((TypeInfo *)local_a0,ERROR_TYPE);
    bVar4 = operator==(&this->lastCalculatedType,(TypeInfo *)local_a0);
    pcVar1 = local_90[0]._M_local_buf + 8;
    if (local_98._M_p != pcVar1) {
      operator_delete(local_98._M_p);
    }
    if (bVar4) {
      return;
    }
    if ((this->lastCalculatedType).type == BOOLEAN) {
      pIVar3 = (stm->statement)._M_t.
               super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
               super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
               super__Head_base<0UL,_IStatement_*,_false>._M_head_impl;
      (*(code *)*(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
      TypeInfo::TypeInfo((TypeInfo *)local_a0,VOID);
      (this->lastCalculatedType).isPrimitive = (bool)local_a0[0];
      *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_a0._1_3_;
      (this->lastCalculatedType).type = local_a0._4_4_;
      std::__cxx11::string::operator=
                ((string *)&(this->lastCalculatedType).className,(string *)&local_98);
      if (local_98._M_p == pcVar1) {
        return;
      }
      goto LAB_00121bf5;
    }
    TypeInfo::TypeInfo((TypeInfo *)local_a0,BOOLEAN);
    TypeInfo::TypeInfo(&local_50,(this->lastCalculatedType).type);
    CError::GetTypeErrorMessage_abi_cxx11_(&local_70,(CError *)local_a0,&local_50,in_RCX);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.className._M_dataplus._M_p != &local_50.className.field_2) {
      operator_delete(local_50.className._M_dataplus._M_p);
    }
    if (local_98._M_p != pcVar1) {
      operator_delete(local_98._M_p);
    }
    CError::CError((CError *)local_a0,&local_70,
                   &(stm->super_IStatement).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_a0);
    if (local_a0 != (undefined1  [8])local_90) {
      operator_delete((void *)local_a0);
    }
    paVar5 = &local_70.field_2;
  }
  local_98._M_p = *(pointer *)(paVar5->_M_local_buf + -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p == paVar5) {
    return;
  }
LAB_00121bf5:
  operator_delete(local_98._M_p);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CWhileStm &stm ) 
{
    std::cout << "typechecker: CWhileStm\n";

    if( stm.conditionExpression && stm.statement ) {
		stm.conditionExpression->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
		if( lastCalculatedType.type != enums::TPrimitiveType::BOOLEAN ) {
			auto errorMessage = CError::GetTypeErrorMessage( TypeInfo( enums::TPrimitiveType::BOOLEAN), lastCalculatedType.type );
			errors.push_back( CError( errorMessage, stm.position ) );
            return;
		}
        stm.statement->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
	}
}